

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pgraph_class_kelvin.cc
# Opt level: O0

void __thiscall hwtest::pgraph::MthdKelvinShadeMode::emulate_mthd(MthdKelvinShadeMode *this)

{
  uint32_t uVar1;
  _Bool _Var2;
  uint local_14;
  uint32_t err;
  MthdKelvinShadeMode *this_local;
  
  pgraph_kelvin_check_err19(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  local_14 = 0;
  _Var2 = pgraph_in_begin_end(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp);
  if (_Var2) {
    local_14 = 4;
  }
  uVar1 = (this->super_SingleMthdTest).super_MthdTest.val;
  if ((uVar1 != 0x1d00) && (uVar1 != 0x1d01)) {
    local_14 = local_14 | 1;
  }
  if (local_14 == 0) {
    if ((this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.nsource == 0) {
      (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b =
           (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b &
           0xffffff7f | ((this->super_SingleMthdTest).super_MthdTest.val & 1) << 7;
      pgraph_bundle(&(this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp,0x12,0,
                    (this->super_SingleMthdTest).super_MthdTest.super_StateTest.exp.bundle_config_b,
                    true);
    }
  }
  else {
    MthdTest::warn((MthdTest *)this,local_14);
  }
  return;
}

Assistant:

void emulate_mthd() override {
		pgraph_kelvin_check_err19(&exp);
		uint32_t err = 0;
		if (pgraph_in_begin_end(&exp))
			err |= 4;
		switch (val) {
			case 0x1d00:
				break;
			case 0x1d01:
				break;
			default:
				err |= 1;
		}
		if (err) {
			warn(err);
		} else {
			if (!exp.nsource) {
				insrt(exp.bundle_config_b, 7, 1, val);
				pgraph_bundle(&exp, BUNDLE_CONFIG_B, 0, exp.bundle_config_b, true);
			}
		}
	}